

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O3

void __thiscall
cppcms::impl::buddy_allocator::buddy_allocator(buddy_allocator *this,size_t memory_size)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  buddy_allocator *pbVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  buddy_allocator *pbVar8;
  bool bVar9;
  
  uVar5 = memory_size - 0x220;
  this->memory_size_ = uVar5;
  this->max_bit_size_ = -1;
  memset(this,0,0x200);
  pbVar4 = this + 1;
  iVar1 = -1;
  while( true ) {
    uVar3 = 0x3e;
    while (uVar6 = 2L << ((byte)uVar3 & 0x3f), uVar6 <= uVar5 || uVar5 < uVar6 >> 1) {
      bVar9 = uVar3 < 2;
      uVar3 = uVar3 - 1;
      if (bVar9) {
        return;
      }
    }
    if ((long)uVar3 < 5) break;
    lVar7 = 1L << ((byte)uVar3 & 0x3f);
    uVar5 = uVar5 - lVar7;
    pbVar8 = (buddy_allocator *)((long)pbVar4->free_list_ + lVar7);
    iVar2 = (int)uVar3;
    *(int *)pbVar4->free_list_ = iVar2;
    pbVar4->free_list_[1] = (page *)0x0;
    pbVar4->free_list_[2] = (page *)0x0;
    this->free_list_[uVar3] = (page *)pbVar4;
    pbVar4 = pbVar8;
    if (iVar1 == -1) {
      this->max_bit_size_ = iVar2;
      iVar1 = iVar2;
    }
  }
  return;
}

Assistant:

buddy_allocator(size_t memory_size)
	{
		assert(sizeof(*this) <= memory_size);
		assert(sizeof(page) <= alignment * 2);
		assert(sizeof(*this) % alignment == 0);
		memory_size_ = memory_size - sizeof(*this);
		max_bit_size_ = -1;
		memset(free_list_,0,sizeof(free_list_));
		LOG("Usable memory %zd",memory_size_);
		char *pos = memory();
		size_t reminder = memory_size_;
		for(;;) {
			int bits = containts_bits(reminder);
			if(bits < alignment_bits + 1)
				break;
			size_t page_size = size_t(1) << bits;
			page *p=reinterpret_cast<page *>(pos);
			reminder -= page_size;
			LOG("Added chunk of size %zd (%d) at pos %zx reminder %zd",page_size,bits,pos - memory(),reminder);
			pos+= page_size;
			p->bits = bits;
			p->prev = 0;
			p->next = 0;
			free_list_[bits] = p;
			if(max_bit_size_ == -1)
				max_bit_size_ = bits;
		}
	}